

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
hdc::Graph<int>::coloring
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,Graph<int> *this,int n_colors)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference piVar9;
  mapped_type *pmVar10;
  pointer ppVar11;
  ostream *poVar12;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  _Self local_2e0;
  _Base_ptr local_2d8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_2d0;
  iterator j;
  _Rb_tree_const_iterator<int> local_2a8;
  _Self local_2a0;
  _Base_ptr local_298;
  _Rb_tree_const_iterator<int> local_290;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> availableColors;
  undefined1 local_250 [4];
  int node;
  _Base_ptr local_230;
  undefined1 local_228;
  undefined1 local_220 [56];
  undefined1 local_1e8;
  value_type local_1dc;
  iterator iStack_1d8;
  int i;
  iterator it1;
  undefined1 local_1c8 [4];
  int max_color;
  set<int,_std::less<int>,_std::allocator<int>_> colorsPool;
  undefined1 local_190 [7];
  bool foundVertex;
  stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  st_edges;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  set<int,_std::less<int>,_std::allocator<int>_> removed;
  undefined1 local_b0 [8];
  Graph<int> aux;
  int n_colors_local;
  Graph<int> *this_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *r;
  
  aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = n_colors;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (__return_storage_ptr__);
  Graph((Graph<int> *)local_b0,this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)
             &st_edges.c.
              super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  stack<std::set<int,std::less<int>,std::allocator<int>>,std::deque<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
  ::
  stack<std::deque<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,void>
            ((stack<std::set<int,std::less<int>,std::allocator<int>>,std::deque<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
              *)local_190);
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8);
  it1._M_node._4_4_ = -1;
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator(&stack0xfffffffffffffe28);
  for (local_1dc = 0;
      local_1dc < aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      local_1dc = local_1dc + 1) {
    pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8,&local_1dc);
    local_220._48_8_ = pVar13.first._M_node;
    local_1e8 = pVar13.second;
  }
  do {
    if ((colorsPool._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
      sVar4 = std::
              map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::size((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)local_b0);
      if (sVar4 == 0) {
        to_str_abi_cxx11_((Graph<int> *)local_250);
        std::operator<<((ostream *)&std::cout,(string *)local_250);
        std::__cxx11::string::~string((string *)local_250);
        while (sVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size
                                 ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                                  &st_edges.c.
                                   super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node), sVar5 != 0) {
          pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                             ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                              &st_edges.c.
                               super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node);
          availableColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *pvVar6;
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&it,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8);
          std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_290);
          insertNode((Graph<int> *)local_b0,
                     availableColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
          pvVar7 = std::
                   stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ::top((stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                          *)local_190);
          local_298 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar7);
          local_290._M_node = local_298;
          while( true ) {
            pvVar7 = std::
                     stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::top((stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                            *)local_190);
            local_2a0._M_node =
                 (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar7);
            bVar1 = std::operator!=(&local_290,&local_2a0);
            iVar2 = availableColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            if (!bVar1) break;
            piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&local_290);
            makeEdge((Graph<int> *)local_b0,iVar2,*piVar9);
            piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&local_290);
            sVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::count(__return_storage_ptr__,piVar9);
            if (sVar8 != 0) {
              piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&local_290);
              pmVar10 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[](__return_storage_ptr__,piVar9);
              std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&it,pmVar10);
            }
            std::_Rb_tree_const_iterator<int>::operator++(&local_290);
          }
          local_2a8._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
          piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&local_2a8);
          iVar2 = *piVar9;
          pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](__return_storage_ptr__,
                                 (key_type *)
                                 ((long)&availableColors._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 4));
          *pmVar10 = iVar2;
          pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](__return_storage_ptr__,
                                 (key_type *)
                                 ((long)&availableColors._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 4));
          if (it1._M_node._4_4_ < *pmVar10) {
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](__return_storage_ptr__,
                                 (key_type *)
                                 ((long)&availableColors._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 4));
            it1._M_node._4_4_ = *pmVar10;
          }
          to_str_abi_cxx11_((Graph<int> *)&j);
          std::operator<<((ostream *)&std::cout,(string *)&j);
          std::__cxx11::string::~string((string *)&j);
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                     &st_edges.c.
                      super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
          std::
          stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::pop((stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 *)local_190);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&it);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::_Rb_tree_iterator(&local_2d0);
        local_2d8 = (_Base_ptr)
                    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::begin(__return_storage_ptr__);
        local_2d0._M_node = local_2d8;
        while( true ) {
          local_2e0._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         (__return_storage_ptr__);
          bVar1 = std::operator!=(&local_2d0,&local_2e0);
          if (!bVar1) break;
          ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_2d0);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ppVar11->first);
          poVar12 = std::operator<<(poVar12,": ");
          ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_2d0);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,ppVar11->second);
          std::operator<<(poVar12,'\n');
          std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_2d0);
        }
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                  (&this->assignedColors,__return_storage_ptr__);
        poVar12 = std::operator<<((ostream *)&std::cout,"#colors = ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,it1._M_node._4_4_ + 1);
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8);
        std::
        stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::~stack((stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)local_190);
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                   &st_edges.c.
                    super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                    ._M_finish._M_node);
        ~Graph((Graph<int> *)local_b0);
        if ((aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) {
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                    (__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      std::operator<<((ostream *)&std::cout,"Graph coloring: couldn\'t colore graph\nExiting...\n");
      exit(0);
    }
    colorsPool._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    local_220._40_8_ =
         std::
         map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::begin((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)local_b0);
    iStack_1d8 = (iterator)local_220._40_8_;
    while( true ) {
      local_220._32_8_ =
           std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::end((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)local_b0);
      bVar1 = std::operator!=(&stack0xfffffffffffffe28,(_Self *)(local_220 + 0x20));
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->(&stack0xfffffffffffffe28);
      iVar2 = countEdges((Graph<int> *)local_b0,ppVar3->first);
      if (iVar2 < aux.assignedColors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
        to_str_abi_cxx11_((Graph<int> *)local_220);
        std::operator<<((ostream *)&std::cout,(string *)local_220);
        std::__cxx11::string::~string((string *)local_220);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator->(&stack0xfffffffffffffe28);
        pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_node,&ppVar3->first);
        local_230 = (_Base_ptr)pVar13.first._M_node;
        local_228 = pVar13.second;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator->(&stack0xfffffffffffffe28);
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                   &st_edges.c.
                    super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,&ppVar3->first);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator->(&stack0xfffffffffffffe28);
        std::
        stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::push((stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)local_190,&ppVar3->second);
        colorsPool._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator->(&stack0xfffffffffffffe28);
        removeNode((Graph<int> *)local_b0,ppVar3->first);
        break;
      }
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator++(&stack0xfffffffffffffe28);
    }
  } while( true );
}

Assistant:

std::map<T, int> coloring(int n_colors) {
            std::map<T, int> r;
            Graph<T> aux = *this;
            std::set<T> removed;
            std::stack<T> st;
            std::stack<std::set<T> > st_edges;
            bool foundVertex = true;
            std::set<int> colorsPool;
            int max_color = -1;

            typename std::map<T, std::set<T> >::iterator it1;

            for (int i = 0; i < n_colors; ++i) {
                colorsPool.insert(i);
            }

            while (foundVertex) {
                foundVertex = false;

                for (it1 = aux.graph.begin(); it1 != aux.graph.end(); ++it1) {
                    if (aux.countEdges(it1->first) < n_colors) {
                        std::cout << aux.to_str();

                        removed.insert(it1->first);
                        st.push(it1->first);
                        st_edges.push(it1->second);
                        foundVertex = true;
                        aux.removeNode(it1->first);
                        break;
                    }
                }
            }

            if (aux.graph.size() != 0) {
                std::cout << "Graph coloring: couldn't colore graph\nExiting...\n";
                exit(0);
            }

            std::cout << aux.to_str();

            while (st.size() > 0) {
                T node = st.top();
                std::set<int> availableColors = colorsPool;
                typename std::set<T>::iterator it;

                aux.insertNode(node);

                for (it = st_edges.top().begin(); it != st_edges.top().end(); ++it) {
                    aux.makeEdge(node, *it);

                    if (r.count(*it) > 0) {
                        availableColors.erase(r[*it]);
                    }
                }

                r[node] = *availableColors.begin();

                if (r[node] > max_color) {
                    max_color = r[node];
                }

                std::cout << aux.to_str();
                st.pop();
                st_edges.pop();
            }

            typename std::map<T, int>::iterator j;

            for (j = r.begin(); j != r.end(); ++j) {
                std::cout << j->first << ": " << j->second << '\n';
            }

            assignedColors = r;
            std::cout << "#colors = " << (max_color + 1) << std::endl;
            return r;
        }